

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_resolv_gai.c
# Opt level: O3

void resolv_worker(void *index)

{
  uint uVar1;
  int iVar2;
  nni_aio *pnVar3;
  int *piVar4;
  void *pvVar5;
  char *pcVar6;
  int iVar7;
  nng_err result;
  addrinfo *paVar8;
  char local_188 [8];
  char host [256];
  char local_80 [8];
  char serv [8];
  addrinfo *local_38;
  addrinfo *results;
  
  nni_thr_set_name((nni_thr *)0x0,"nng:resolver");
  nni_mtx_lock(&resolv_mtx);
  iVar7 = (int)index;
LAB_0011e528:
  do {
    while (pnVar3 = (nni_aio *)nni_list_first(&resolv_aios), pnVar3 == (nni_aio *)0x0) {
      if (resolv_fini != '\0') {
        nni_mtx_unlock(&resolv_mtx);
        return;
      }
      nni_cv_wait(&resolv_cv);
    }
    piVar4 = (int *)nni_aio_get_prov_data(pnVar3);
    nni_aio_list_remove(pnVar3);
    resolv_active[iVar7] = pnVar3;
    pcVar6 = *(char **)(piVar4 + 2);
    if (pcVar6 == (char *)0x0) {
      pcVar6 = "";
    }
    snprintf(local_188,0x100,"%s",pcVar6);
    snprintf(local_80,8,"%u",(ulong)*(ushort *)(piVar4 + 4));
    serv[0] = '\0';
    serv[1] = '\0';
    serv[2] = '\0';
    serv[3] = '\0';
    serv[4] = '\0';
    serv[5] = '\0';
    serv[6] = '\0';
    serv[7] = '\0';
    local_38 = (addrinfo *)0x0;
    iVar2 = *piVar4;
    if (iVar2 != 0) {
      if (iVar2 == 3) {
        uVar1 = 2;
      }
      else {
        if (iVar2 != 4) {
          resolv_active[iVar7] = (nni_aio *)0x0;
          nni_aio_finish_error(pnVar3,NNG_ENOTSUP);
          goto LAB_0011e528;
        }
        uVar1 = 10;
      }
      serv = (char  [8])((ulong)uVar1 << 0x20);
    }
    serv = (char  [8])(CONCAT44(serv._4_4_,(uint)*(byte *)(piVar4 + 1)) | 0x420);
    nni_mtx_unlock(&resolv_mtx);
    pcVar6 = local_188;
    if (local_188[0] == '\0') {
      pcVar6 = (char *)0x0;
    }
    iVar2 = getaddrinfo(pcVar6,local_80,(addrinfo *)serv,&local_38);
    nni_mtx_lock(&resolv_mtx);
    pnVar3 = resolv_active[iVar7];
    if (pnVar3 == (nni_aio *)0x0) {
      if (iVar2 == 0) {
LAB_0011e689:
        freeaddrinfo(local_38);
      }
    }
    else {
      resolv_active[iVar7] = (nni_aio *)0x0;
      switch(iVar2) {
      case 0:
        for (paVar8 = local_38; paVar8 != (addrinfo *)0x0; paVar8 = paVar8->ai_next) {
          if ((paVar8->ai_addr->sa_family | 8) == 10) {
            pvVar5 = nni_aio_get_prov_data(pnVar3);
            nni_aio_set_prov_data(pnVar3,(void *)0x0);
            if (pvVar5 == (void *)0x0) {
              nni_panic("%s: %d: assert err: %s",
                        "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/posix/posix_resolv_gai.c"
                        ,0x115,"item != NULL");
            }
            nni_posix_sockaddr2nn
                      (*(nni_sockaddr **)((long)pvVar5 + 0x18),paVar8->ai_addr,
                       (ulong)paVar8->ai_addrlen);
            freeaddrinfo(local_38);
            nni_aio_finish(pnVar3,NNG_OK,0);
            goto LAB_0011e528;
          }
        }
        nni_aio_finish_error(pnVar3,NNG_EADDRINVAL);
        goto LAB_0011e689;
      case -0xb:
        piVar4 = __errno_location();
        result = nni_plat_errno(*piVar4);
        break;
      case -10:
        result = NNG_ENOMEM;
        break;
      case -9:
      case -6:
      case -4:
switchD_0011e675_caseD_fffffff7:
        result = iVar2 + NNG_ESYSERR;
        break;
      case -8:
      case -5:
      case -2:
        result = NNG_EADDRINVAL;
        break;
      case -7:
        result = NNG_ENOTSUP;
        break;
      case -3:
        result = NNG_EAGAIN;
        break;
      case -1:
        result = NNG_EINVAL;
        break;
      default:
        if (iVar2 != -0x65) goto switchD_0011e675_caseD_fffffff7;
        result = NNG_ECANCELED;
      }
      nni_aio_finish_error(pnVar3,result);
    }
  } while( true );
}

Assistant:

void
resolv_worker(void *index)
{
	int              tid = (int) (intptr_t) index;
	struct addrinfo  hints;
	struct addrinfo *results;
	struct addrinfo *probe;
	int              rv;
	char             serv[8];
	char             host[256];
	nni_aio         *aio;
	nni_resolv_item *item;

	nni_thr_set_name(NULL, "nng:resolver");

	nni_mtx_lock(&resolv_mtx);
	for (;;) {

		if ((aio = nni_list_first(&resolv_aios)) == NULL) {
			if (resolv_fini) {
				break;
			}
			nni_cv_wait(&resolv_cv);
			continue;
		}

		item = nni_aio_get_prov_data(aio);
		nni_aio_list_remove(aio);
		resolv_active[tid] = aio;

		snprintf(host, sizeof(host), "%s",
		    item->ri_host ? item->ri_host : "");
		snprintf(serv, sizeof(serv), "%u", item->ri_port);

		// We treat these all as IP addresses.  The service and the
		// host part are split.
		memset(&hints, 0, sizeof(hints));

		results = NULL;

		switch (item->ri_family) {
		case NNG_AF_INET:
			hints.ai_family = AF_INET;
			break;

#ifdef NNG_ENABLE_IPV6
		case NNG_AF_INET6:
			hints.ai_family = AF_INET6;
			break;
		case NNG_AF_UNSPEC:
			hints.ai_family = AF_UNSPEC;
			break;
#else
		case NNG_AF_UNSPEC:
			hints.ai_family = AF_INET;
			break;
#endif
		default:
			resolv_active[tid] = NULL;
			nni_aio_finish_error(aio, NNG_ENOTSUP);
			continue;
		}

#ifdef AI_ADDRCONFIG
		hints.ai_flags = AI_ADDRCONFIG;
#endif
		if (item->ri_passive) {
			hints.ai_flags |= AI_PASSIVE;
		}
		hints.ai_socktype = SOCK_STREAM;
		hints.ai_flags |= AI_NUMERICSERV;

		// We can pass any non-zero service number, but we have to pass
		// *something*, in case we are using a NULL hostname.  The lock
		// is dropped to allow other submissions, and other threads to
		// process.
		nni_mtx_unlock(&resolv_mtx);
		rv = getaddrinfo(
		    host[0] != 0 ? host : NULL, serv, &hints, &results);
		nni_mtx_lock(&resolv_mtx);

		if ((aio = resolv_active[tid]) == NULL) {
			// no more interest (canceled), so ignore the result
			// and carry on
			if (rv == 0) {
				freeaddrinfo(results);
			}
			continue;
		}
		resolv_active[tid] = NULL;

		if (rv != 0) {
			rv = posix_gai_errno(rv);
			nni_aio_finish_error(aio, rv);
			continue;
		}

		// We only take the first matching address.  Presumably
		// DNS load balancing is done by the resolver/server.

		for (probe = results; probe != NULL; probe = probe->ai_next) {
			if (probe->ai_addr->sa_family == AF_INET) {
				break;
			}
#ifdef NNG_ENABLE_IPV6
			if (probe->ai_addr->sa_family == AF_INET6) {
				break;
			}
#endif
		}

		if (probe == NULL) {
			// no match
			nni_aio_finish_error(aio, NNG_EADDRINVAL);
			freeaddrinfo(results);
			continue;
		}

		item = nni_aio_get_prov_data(aio);
		nni_aio_set_prov_data(aio, NULL);
		NNI_ASSERT(item != NULL);

		(void) nni_posix_sockaddr2nn(
		    item->ri_sa, probe->ai_addr, probe->ai_addrlen);

		freeaddrinfo(results);
		nni_aio_finish(aio, 0, 0);
	}
	nni_mtx_unlock(&resolv_mtx);
}